

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql_statement.hpp
# Opt level: O2

AlterStatement * __thiscall duckdb::SQLStatement::Cast<duckdb::AlterStatement>(SQLStatement *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == ALTER_STATEMENT) {
    return (AlterStatement *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Failed to cast statement to type - statement type mismatch",
             &local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE && TARGET::TYPE != StatementType::INVALID_STATEMENT) {
			throw InternalException("Failed to cast statement to type - statement type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}